

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsluv.c
# Opt level: O0

void xyz2rgb(Triplet *in_out)

{
  Triplet *in_RDI;
  double dVar1;
  double dVar2;
  double dVar3;
  double b;
  double g;
  double r;
  double in_stack_ffffffffffffffd8;
  
  dot_product(m,in_RDI);
  dVar1 = from_linear(in_stack_ffffffffffffffd8);
  dot_product(m + 1,in_RDI);
  dVar2 = from_linear(in_stack_ffffffffffffffd8);
  dot_product(m + 2,in_RDI);
  dVar3 = from_linear(in_stack_ffffffffffffffd8);
  in_RDI->a = dVar1;
  in_RDI->b = dVar2;
  in_RDI->c = dVar3;
  return;
}

Assistant:

static void
xyz2rgb(Triplet* in_out)
{
    double r = from_linear(dot_product(&m[0], in_out));
    double g = from_linear(dot_product(&m[1], in_out));
    double b = from_linear(dot_product(&m[2], in_out));
    in_out->a = r;
    in_out->b = g;
    in_out->c = b;
}